

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::flags_to_qualifiers_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,Bitset *flags)

{
  bool bVar1;
  BaseType BVar2;
  allocator local_21;
  
  bVar1 = Bitset::get(flags,0x14eb);
  if (bVar1) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"restrict ",&local_21);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    BVar2 = type->basetype;
    if (((BVar2 - Half < 3) && ((flags->lower & 0x40000000000) != 0)) &&
       ((this->backend).support_precise_qualifier == true)) {
      ::std::__cxx11::string::assign((char *)__return_storage_ptr__);
      BVar2 = type->basetype;
    }
    if ((BVar2 < AccelerationStructure) && ((0x72180U >> (BVar2 & (Image|Struct)) & 1) != 0)) {
      if ((this->options).es == true) {
        Compiler::get_entry_point(&this->super_Compiler);
        if (((type->basetype == UInt) && ((this->options).es == true)) &&
           ((this->options).version < 300)) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else if ((flags->lower & 1) == 0) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      else if (((this->backend).allow_precision_qualifiers == true) && ((flags->lower & 1) != 0)) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::flags_to_qualifiers_glsl(const SPIRType &type, const Bitset &flags)
{
	// GL_EXT_buffer_reference variables can be marked as restrict.
	if (flags.get(DecorationRestrictPointerEXT))
		return "restrict ";

	string qual;

	if (type_is_floating_point(type) && flags.get(DecorationNoContraction) && backend.support_precise_qualifier)
		qual = "precise ";

	// Structs do not have precision qualifiers, neither do doubles (desktop only anyways, so no mediump/highp).
	bool type_supports_precision =
			type.basetype == SPIRType::Float || type.basetype == SPIRType::Int || type.basetype == SPIRType::UInt ||
			type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage ||
			type.basetype == SPIRType::Sampler;

	if (!type_supports_precision)
		return qual;

	if (options.es)
	{
		auto &execution = get_entry_point();

		if (type.basetype == SPIRType::UInt && is_legacy_es())
		{
			// HACK: This is a bool. See comment in type_to_glsl().
			qual += "lowp ";
		}
		else if (flags.get(DecorationRelaxedPrecision))
		{
			bool implied_fmediump = type.basetype == SPIRType::Float &&
			                        options.fragment.default_float_precision == Options::Mediump &&
			                        execution.model == ExecutionModelFragment;

			bool implied_imediump = (type.basetype == SPIRType::Int || type.basetype == SPIRType::UInt) &&
			                        options.fragment.default_int_precision == Options::Mediump &&
			                        execution.model == ExecutionModelFragment;

			qual += (implied_fmediump || implied_imediump) ? "" : "mediump ";
		}
		else
		{
			bool implied_fhighp =
			    type.basetype == SPIRType::Float && ((options.fragment.default_float_precision == Options::Highp &&
			                                          execution.model == ExecutionModelFragment) ||
			                                         (execution.model != ExecutionModelFragment));

			bool implied_ihighp = (type.basetype == SPIRType::Int || type.basetype == SPIRType::UInt) &&
			                      ((options.fragment.default_int_precision == Options::Highp &&
			                        execution.model == ExecutionModelFragment) ||
			                       (execution.model != ExecutionModelFragment));

			qual += (implied_fhighp || implied_ihighp) ? "" : "highp ";
		}
	}
	else if (backend.allow_precision_qualifiers)
	{
		// Vulkan GLSL supports precision qualifiers, even in desktop profiles, which is convenient.
		// The default is highp however, so only emit mediump in the rare case that a shader has these.
		if (flags.get(DecorationRelaxedPrecision))
			qual += "mediump ";
	}

	return qual;
}